

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_split.hpp
# Opt level: O0

pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
* __thiscall
jessilib::
word_split_once<std::basic_string_view<char,std::char_traits<char>>,char_const*,char_const*,char>
          (pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
           *__return_storage_ptr__,jessilib *this,char *begin,char *end,char in_whitespace)

{
  bool bVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  size_t local_78;
  char *local_70;
  size_t local_68;
  char *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  char *itr;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  result;
  char in_whitespace_local;
  char *end_local;
  char *begin_local;
  
  result.second._M_str._7_1_ = (char)end;
  std::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
  ::
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_true>
            ((pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              *)&itr);
  end_local = (char *)this;
  if (this < begin) {
    while( true ) {
      bVar1 = false;
      if (end_local != begin) {
        bVar1 = *end_local == result.second._M_str._7_1_;
      }
      if (!bVar1) break;
      end_local = end_local + 1;
    }
    for (local_48 = end_local; local_48 != begin; local_48 = local_48 + 1) {
      if (*local_48 == result.second._M_str._7_1_) {
        bVar2 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                          (end_local,local_48);
        local_58 = (char *)bVar2._M_len;
        itr = local_58;
        local_50 = bVar2._M_str;
        result.first._M_len = (size_t)local_50;
        do {
          local_48 = local_48 + 1;
          bVar1 = false;
          if (local_48 != begin) {
            bVar1 = *local_48 == result.second._M_str._7_1_;
          }
        } while (bVar1);
        bVar2 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                          (local_48,begin);
        local_68 = bVar2._M_len;
        local_60 = bVar2._M_str;
        (__return_storage_ptr__->first)._M_len = (size_t)itr;
        (__return_storage_ptr__->first)._M_str = (char *)result.first._M_len;
        (__return_storage_ptr__->second)._M_len = local_68;
        (__return_storage_ptr__->second)._M_str = local_60;
        return __return_storage_ptr__;
      }
    }
    bVar2 = make_word_split_member<std::basic_string_view<char,_std::char_traits<char>_>,_const_char_*,_const_char_*,_nullptr>
                      (end_local,begin);
    local_78 = bVar2._M_len;
    local_70 = bVar2._M_str;
    (__return_storage_ptr__->first)._M_len = local_78;
    (__return_storage_ptr__->first)._M_str = local_70;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
  }
  else {
    (__return_storage_ptr__->first)._M_len = (size_t)itr;
    (__return_storage_ptr__->first)._M_str = (char *)result.first._M_len;
    (__return_storage_ptr__->second)._M_len = (size_t)result.first._M_str;
    (__return_storage_ptr__->second)._M_str = (char *)result.second._M_len;
  }
  return __return_storage_ptr__;
}

Assistant:

constexpr auto word_split_once(ItrT begin, EndT end, ElementT in_whitespace) {
	static_assert(sizeof...(OptionalMemberT) <= 1, "Too many member types specified for OptionalMemberT");
	using MemberT = std::tuple_element_t<0, std::tuple<OptionalMemberT..., std::basic_string<ElementT>>>;

	std::pair<MemberT, MemberT> result;
	if (begin >= end) {
		// Nothing to word_split
		return result;
	}

	while (begin != end
		&& *begin == in_whitespace) {
		++begin;
	}

	for (auto itr = begin; itr != end; ++itr) {
		if (*itr == in_whitespace) {
			// in_whitespace found; word_split upon it
			result.first = make_word_split_member<MemberT>(begin, itr);

			++itr;
			while (itr != end
				&& *itr == in_whitespace) {
				++itr;
			}

			result.second = make_word_split_member<MemberT>(itr, end);
			return result;
		}
	}

	// in_whitespace not found
	result.first = make_word_split_member<MemberT>(begin, end);
	return result;
}